

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

void __thiscall
axl::sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release
          (StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this)

{
  if (this->m_hdr != (BufHdr *)0x0) {
    rc::RefCount::release(&this->m_hdr->super_RefCount);
  }
  *(undefined8 *)((long)&this->m_hdr + 1) = 0;
  *(undefined8 *)((long)&this->m_length + 1) = 0;
  this->m_p = (C *)0x0;
  this->m_hdr = (BufHdr *)0x0;
  return;
}

Assistant:

void
	release() {
		if (m_hdr)
			m_hdr->release();

		initialize();
	}